

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

void __thiscall
duckdb::Prefix::Prefix
          (Prefix *this,unsafe_unique_ptr<FixedSizeAllocator> *allocator,Node ptr_p,idx_t count)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  idx_t iVar3;
  long *plVar4;
  pointer this_00;
  data_ptr_t pdVar5;
  long *plVar6;
  
  _Var1._M_head_impl =
       (allocator->
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  plVar4 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                     (((ulong)ptr_p.super_IndexPointer.data & 0xffffffff) %
                     *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
  for (plVar6 = (long *)*plVar4; ((ulong)ptr_p.super_IndexPointer.data & 0xffffffff) != plVar6[1];
      plVar6 = (long *)*plVar6) {
    plVar4 = plVar6;
  }
  this_00 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
            ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                          *)(*plVar4 + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this_00,true);
  iVar2 = (_Var1._M_head_impl)->segment_size;
  iVar3 = (_Var1._M_head_impl)->bitmask_offset;
  this->data = pdVar5 + iVar3 + (ptr_p.super_IndexPointer.data._4_4_ & 0xffffff) * iVar2;
  this->ptr = (Node *)(pdVar5 + iVar3 + (ptr_p.super_IndexPointer.data._4_4_ & 0xffffff) * iVar2 +
                      count + 1);
  this->in_memory = true;
  return;
}

Assistant:

Prefix::Prefix(unsafe_unique_ptr<FixedSizeAllocator> &allocator, const Node ptr_p, const idx_t count) {
	data = allocator->Get(ptr_p, true);
	ptr = reinterpret_cast<Node *>(data + count + 1);
	in_memory = true;
}